

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

void __thiscall
slang::syntax::CoverpointSyntax::setChild(CoverpointSyntax *this,size_t index,TokenOrSyntax child)

{
  size_type sVar1;
  Info *pIVar2;
  undefined1 uVar3;
  NumericTokenFlags NVar4;
  uint32_t uVar5;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *pSVar6;
  ExpressionSyntax *pEVar7;
  variant_alternative_t<0UL,_variant<Token,_const_SyntaxNode_*>_> *pvVar8;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar9;
  SyntaxList<slang::syntax::MemberSyntax> *pSVar10;
  DataTypeSyntax *pDVar11;
  NamedLabelSyntax *pNVar12;
  CoverageIffClauseSyntax *pCVar13;
  logic_error *this_00;
  long *plVar14;
  char *pcVar15;
  size_type *psVar16;
  long *plVar17;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (9 < index) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    local_d0[0] = local_c0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_d0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O3/extern/slang/source/AllSyntax.cpp"
               ,"");
    plVar14 = (long *)std::__cxx11::string::append((char *)local_d0);
    local_b0._M_dataplus._M_p = (pointer)*plVar14;
    psVar16 = (size_type *)(plVar14 + 2);
    if ((size_type *)local_b0._M_dataplus._M_p == psVar16) {
      local_b0.field_2._M_allocated_capacity = *psVar16;
      local_b0.field_2._8_8_ = plVar14[3];
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    }
    else {
      local_b0.field_2._M_allocated_capacity = *psVar16;
    }
    local_b0._M_string_length = plVar14[1];
    *plVar14 = (long)psVar16;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    std::__cxx11::to_string(&local_70,0xdb4);
    std::operator+(&local_50,&local_b0,&local_70);
    plVar14 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = (long *)*plVar14;
    plVar17 = plVar14 + 2;
    if (local_90 == plVar17) {
      local_80 = *plVar17;
      lStack_78 = plVar14[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *plVar17;
    }
    local_88 = plVar14[1];
    *plVar14 = (long)plVar17;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    plVar14 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_f0 = (long *)*plVar14;
    plVar17 = plVar14 + 2;
    if (local_f0 == plVar17) {
      local_e0 = *plVar17;
      lStack_d8 = plVar14[3];
      local_f0 = &local_e0;
    }
    else {
      local_e0 = *plVar17;
    }
    local_e8 = plVar14[1];
    *plVar14 = (long)plVar17;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    std::logic_error::logic_error(this_00,(string *)&local_f0);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  switch(index) {
  case 0:
    ppSVar9 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    pSVar6 = SyntaxNode::as<slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>>
                       (*ppSVar9);
    (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
         (pSVar6->super_SyntaxListBase).super_SyntaxNode.parent;
    (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
         (pSVar6->super_SyntaxListBase).super_SyntaxNode.kind;
    (this->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
         (pSVar6->super_SyntaxListBase).childCount;
    sVar1 = (pSVar6->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).
            size_;
    (this->super_MemberSyntax).attributes.
    super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_ =
         (pSVar6->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).
         data_;
    (this->super_MemberSyntax).attributes.
    super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_ = sVar1;
    break;
  case 1:
    ppSVar9 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    if (*ppSVar9 == (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0) {
      pcVar15 = 
      "slang::not_null<slang::syntax::DataTypeSyntax *>::not_null(U &&) [T = slang::syntax::DataTypeSyntax *, U = slang::syntax::DataTypeSyntax *]"
      ;
LAB_002b3773:
      assert::assertFailed
                ("ptr",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                 ,0x1b,pcVar15);
    }
    ppSVar9 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    pDVar11 = SyntaxNode::as<slang::syntax::DataTypeSyntax>(*ppSVar9);
    (this->type).ptr = pDVar11;
    break;
  case 2:
    ppSVar9 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    if (*ppSVar9 == (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0) {
      pNVar12 = (NamedLabelSyntax *)0x0;
    }
    else {
      ppSVar9 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           &child);
      pNVar12 = (NamedLabelSyntax *)*ppSVar9;
      if ((pNVar12->super_SyntaxNode).kind != NamedLabel) {
        pcVar15 = "T &slang::syntax::SyntaxNode::as() [T = slang::syntax::NamedLabelSyntax]";
LAB_002b3696:
        assert::assertFailed
                  ("T::isKind(kind)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/syntax/SyntaxNode.h"
                   ,0x68,pcVar15);
      }
    }
    this->label = pNVar12;
    break;
  case 3:
    pvVar8 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                       ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child)
    ;
    uVar3 = pvVar8->field_0x2;
    NVar4.raw = (pvVar8->numFlags).raw;
    uVar5 = pvVar8->rawLen;
    pIVar2 = pvVar8->info;
    (this->coverpoint).kind = pvVar8->kind;
    (this->coverpoint).field_0x2 = uVar3;
    (this->coverpoint).numFlags = (NumericTokenFlags)NVar4.raw;
    (this->coverpoint).rawLen = uVar5;
    (this->coverpoint).info = pIVar2;
    break;
  case 4:
    ppSVar9 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    if (*ppSVar9 == (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0) {
      pcVar15 = 
      "slang::not_null<slang::syntax::ExpressionSyntax *>::not_null(U &&) [T = slang::syntax::ExpressionSyntax *, U = slang::syntax::ExpressionSyntax *]"
      ;
      goto LAB_002b3773;
    }
    ppSVar9 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    pEVar7 = SyntaxNode::as<slang::syntax::ExpressionSyntax>(*ppSVar9);
    (this->expr).ptr = pEVar7;
    break;
  case 5:
    ppSVar9 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    if (*ppSVar9 == (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0) {
      pCVar13 = (CoverageIffClauseSyntax *)0x0;
    }
    else {
      ppSVar9 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           &child);
      pCVar13 = (CoverageIffClauseSyntax *)*ppSVar9;
      if ((pCVar13->super_SyntaxNode).kind != CoverageIffClause) {
        pcVar15 = "T &slang::syntax::SyntaxNode::as() [T = slang::syntax::CoverageIffClauseSyntax]";
        goto LAB_002b3696;
      }
    }
    this->iff = pCVar13;
    break;
  case 6:
    pvVar8 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                       ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child)
    ;
    uVar3 = pvVar8->field_0x2;
    NVar4.raw = (pvVar8->numFlags).raw;
    uVar5 = pvVar8->rawLen;
    pIVar2 = pvVar8->info;
    (this->openBrace).kind = pvVar8->kind;
    (this->openBrace).field_0x2 = uVar3;
    (this->openBrace).numFlags = (NumericTokenFlags)NVar4.raw;
    (this->openBrace).rawLen = uVar5;
    (this->openBrace).info = pIVar2;
    break;
  case 7:
    ppSVar9 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    pSVar10 = SyntaxNode::as<slang::syntax::SyntaxList<slang::syntax::MemberSyntax>>(*ppSVar9);
    (this->members).super_SyntaxListBase.super_SyntaxNode.parent =
         (pSVar10->super_SyntaxListBase).super_SyntaxNode.parent;
    (this->members).super_SyntaxListBase.super_SyntaxNode.kind =
         (pSVar10->super_SyntaxListBase).super_SyntaxNode.kind;
    (this->members).super_SyntaxListBase.childCount = (pSVar10->super_SyntaxListBase).childCount;
    sVar1 = (pSVar10->super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>).size_;
    (this->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.data_ =
         (pSVar10->super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>).data_;
    (this->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.size_ = sVar1;
    break;
  case 8:
    pvVar8 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                       ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child)
    ;
    uVar3 = pvVar8->field_0x2;
    NVar4.raw = (pvVar8->numFlags).raw;
    uVar5 = pvVar8->rawLen;
    pIVar2 = pvVar8->info;
    (this->closeBrace).kind = pvVar8->kind;
    (this->closeBrace).field_0x2 = uVar3;
    (this->closeBrace).numFlags = (NumericTokenFlags)NVar4.raw;
    (this->closeBrace).rawLen = uVar5;
    (this->closeBrace).info = pIVar2;
    break;
  case 9:
    pvVar8 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                       ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child)
    ;
    uVar3 = pvVar8->field_0x2;
    NVar4.raw = (pvVar8->numFlags).raw;
    uVar5 = pvVar8->rawLen;
    pIVar2 = pvVar8->info;
    (this->emptySemi).kind = pvVar8->kind;
    (this->emptySemi).field_0x2 = uVar3;
    (this->emptySemi).numFlags = (NumericTokenFlags)NVar4.raw;
    (this->emptySemi).rawLen = uVar5;
    (this->emptySemi).info = pIVar2;
  }
  return;
}

Assistant:

void CoverpointSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: type = child.node() ? &child.node()->as<DataTypeSyntax>() : nullptr; return;
        case 2: label = child.node() ? &child.node()->as<NamedLabelSyntax>() : nullptr; return;
        case 3: coverpoint = child.token(); return;
        case 4: expr = child.node() ? &child.node()->as<ExpressionSyntax>() : nullptr; return;
        case 5: iff = child.node() ? &child.node()->as<CoverageIffClauseSyntax>() : nullptr; return;
        case 6: openBrace = child.token(); return;
        case 7: members = child.node()->as<SyntaxList<MemberSyntax>>(); return;
        case 8: closeBrace = child.token(); return;
        case 9: emptySemi = child.token(); return;
        default: ASSUME_UNREACHABLE;
    }
}